

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixFileLock(unixFile *pFile,flock *pLock)

{
  long lVar1;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  unixInodeInfo *pInode;
  int rc;
  flock lock;
  int local_44;
  undefined8 local_28;
  long local_20;
  undefined8 local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(in_RDI + 0x10);
  if ((*(ushort *)(in_RDI + 0x1e) & 3) == 1) {
    if (*(char *)(lVar1 + 0x21) == '\0') {
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = (long)(sqlite3PendingByte + 2);
      local_18 = 0x1fe;
      local_28 = 0xaaaaaaaa00000001;
      local_44 = (*aSyscall[7].pCurrent)((ulong)*(uint *)(in_RDI + 0x18),6,&local_28);
      if (-1 < local_44) {
        *(undefined1 *)(lVar1 + 0x21) = 1;
        *(int *)(lVar1 + 0x1c) = *(int *)(lVar1 + 0x1c) + 1;
      }
    }
    else {
      local_44 = 0;
    }
  }
  else {
    local_44 = (*aSyscall[7].pCurrent)((ulong)*(uint *)(in_RDI + 0x18),6,in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_44;
}

Assistant:

static int unixFileLock(unixFile *pFile, struct flock *pLock){
  int rc;
  unixInodeInfo *pInode = pFile->pInode;
  assert( pInode!=0 );
  assert( sqlite3_mutex_held(pInode->pLockMutex) );
  if( (pFile->ctrlFlags & (UNIXFILE_EXCL|UNIXFILE_RDONLY))==UNIXFILE_EXCL ){
    if( pInode->bProcessLock==0 ){
      struct flock lock;
      /* assert( pInode->nLock==0 ); <-- Not true if unix-excl READONLY used */
      lock.l_whence = SEEK_SET;
      lock.l_start = SHARED_FIRST;
      lock.l_len = SHARED_SIZE;
      lock.l_type = F_WRLCK;
      rc = osSetPosixAdvisoryLock(pFile->h, &lock, pFile);
      if( rc<0 ) return rc;
      pInode->bProcessLock = 1;
      pInode->nLock++;
    }else{
      rc = 0;
    }
  }else{
    rc = osSetPosixAdvisoryLock(pFile->h, pLock, pFile);
  }
  return rc;
}